

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

xmlListPtr xmlListCreate(xmlListDeallocator deallocator,xmlListDataCompare compare)

{
  xmlGenericErrorFunc p_Var1;
  xmlListPtr pxVar2;
  xmlLinkPtr pxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  
  pxVar2 = (xmlListPtr)(*xmlMalloc)(0x18);
  if (pxVar2 == (xmlListPtr)0x0) {
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    pxVar2 = (xmlListPtr)0x0;
    (*p_Var1)(*ppvVar5,"Cannot initialize memory for list");
  }
  else {
    pxVar2->sentinel = (xmlLinkPtr)0x0;
    pxVar2->linkDeallocator = (_func_void_xmlLinkPtr *)0x0;
    pxVar2->linkCompare = (_func_int_void_ptr_void_ptr *)0x0;
    pxVar3 = (xmlLinkPtr)(*xmlMalloc)(0x18);
    pxVar2->sentinel = pxVar3;
    if (pxVar3 == (xmlLinkPtr)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Cannot initialize memory for sentinel");
      (*xmlFree)(pxVar2);
      pxVar2 = (xmlListPtr)0x0;
    }
    else {
      pxVar3->next = pxVar3;
      pxVar3->prev = pxVar3;
      pxVar3->data = (void *)0x0;
      if (deallocator != (xmlListDeallocator)0x0) {
        pxVar2->linkDeallocator = deallocator;
      }
      if (compare == (xmlListDataCompare)0x0) {
        pxVar2->linkCompare = xmlLinkCompare;
      }
      else {
        pxVar2->linkCompare = compare;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlListPtr
xmlListCreate(xmlListDeallocator deallocator, xmlListDataCompare compare)
{
    xmlListPtr l;
    if (NULL == (l = (xmlListPtr )xmlMalloc( sizeof(xmlList)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for list");
        return (NULL);
    }
    /* Initialize the list to NULL */
    memset(l, 0, sizeof(xmlList));

    /* Add the sentinel */
    if (NULL ==(l->sentinel = (xmlLinkPtr )xmlMalloc(sizeof(xmlLink)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for sentinel");
	xmlFree(l);
        return (NULL);
    }
    l->sentinel->next = l->sentinel;
    l->sentinel->prev = l->sentinel;
    l->sentinel->data = NULL;

    /* If there is a link deallocator, use it */
    if (deallocator != NULL)
        l->linkDeallocator = deallocator;
    /* If there is a link comparator, use it */
    if (compare != NULL)
        l->linkCompare = compare;
    else /* Use our own */
        l->linkCompare = xmlLinkCompare;
    return l;
}